

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bean_ptr_impl.hpp
# Opt level: O0

void __thiscall hiberlite::real_bean<A>::~real_bean(real_bean<A> *this)

{
  A *this_00;
  real_bean<A> *this_local;
  
  save(this);
  this_00 = this->obj;
  if (this_00 != (A *)0x0) {
    A::~A(this_00);
    operator_delete(this_00);
  }
  bean_key::~bean_key(&this->key);
  noncopyable::~noncopyable((noncopyable *)this);
  return;
}

Assistant:

real_bean<C>::~real_bean()
{
	save();
	delete obj;
}